

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<long_double>::AutoFill
          (TPZBlockDiagonal<long_double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  long lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  int iVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TPZManVector<int,_10> *blocksize;
  long lVar15;
  long lVar16;
  long lVar17;
  longdouble in_ST0;
  longdouble lVar18;
  longdouble in_ST1;
  longdouble lVar19;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  TPZStack<int,_10> blsizes;
  long local_a8;
  longdouble local_94;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    if (0 < neq) {
      lVar12 = 0;
      do {
        iVar7 = rand();
        lVar10 = (iVar7 * neq) / 0x7fffffff;
        lVar14 = neq - lVar12;
        if (lVar10 < neq - lVar12) {
          lVar14 = lVar10;
        }
        TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar14);
        lVar12 = lVar12 + lVar14;
      } while (lVar12 < neq);
    }
    blocksize = &local_78;
    Initialize(this,&blocksize->super_TPZVec<int>);
    lVar12 = (this->fBlockSize).fNElements;
    if (0 < lVar12) {
      lVar10 = 0;
      do {
        lVar14 = (long)(this->fBlockSize).fStore[lVar10];
        if (0 < lVar14) {
          lVar1 = (this->fBlockPos).fStore[lVar10];
          lVar11 = lVar1 << 4;
          lVar15 = lVar14 * 0x10;
          lVar17 = 0;
          local_a8 = lVar11;
          do {
            if (lVar17 == 0 || symmetric != 1) {
              lVar13 = 0;
              lVar19 = (longdouble)0;
            }
            else {
              plVar8 = (this->fStorage).fStore;
              plVar9 = (longdouble *)(local_a8 + (long)plVar8);
              plVar8 = (longdouble *)((long)plVar8 + lVar11);
              lVar19 = (longdouble)0;
              lVar13 = 0;
              do {
                *plVar8 = *plVar9;
                lVar19 = ABS(*plVar9) + lVar19;
                lVar13 = lVar13 + 1;
                plVar9 = plVar9 + 1;
                plVar8 = plVar8 + lVar14;
                in_ST6 = in_ST5;
              } while (lVar17 != lVar13);
            }
            if (lVar13 < lVar14) {
              lVar16 = lVar15 * lVar13 + lVar11;
              lVar18 = in_ST0;
              lVar2 = in_ST1;
              lVar3 = in_ST2;
              lVar4 = in_ST3;
              lVar5 = in_ST4;
              lVar6 = in_ST5;
              in_ST5 = in_ST6;
              local_94 = lVar19;
              do {
                in_ST4 = lVar6;
                in_ST3 = lVar5;
                in_ST2 = lVar4;
                in_ST1 = lVar3;
                in_ST0 = lVar2;
                TPZMatrix<long_double>::GetRandomVal
                          ((longdouble *)this,(TPZMatrix<long_double> *)blocksize);
                *(longdouble *)((long)(this->fStorage).fStore + lVar16) = lVar18;
                lVar19 = ABS(lVar18) + local_94;
                if (lVar17 == lVar13) {
                  lVar19 = local_94;
                }
                lVar13 = lVar13 + 1;
                lVar16 = lVar16 + lVar15;
                lVar18 = in_ST0;
                lVar2 = in_ST1;
                lVar3 = in_ST2;
                lVar4 = in_ST3;
                lVar5 = in_ST4;
                lVar6 = in_ST5;
                local_94 = lVar19;
              } while (lVar14 != lVar13);
            }
            plVar8 = (this->fStorage).fStore;
            if (ABS(plVar8[lVar1 + lVar17 + lVar17 * lVar14]) < lVar19) {
              plVar8[lVar1 + lVar17 + lVar17 * lVar14] = (longdouble)1 + lVar19;
            }
            lVar17 = lVar17 + 1;
            local_a8 = local_a8 + lVar15;
            lVar11 = lVar11 + 0x10;
            in_ST6 = in_ST5;
          } while (lVar17 != lVar14);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar12);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}